

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_argerror(lua_State *L,int arg,char *extramsg)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  lua_Debug ar;
  
  uVar2 = (ulong)(uint)arg;
  iVar1 = lua_getstack(L,0,&ar);
  if (iVar1 == 0) {
    iVar1 = luaL_error(L,"bad argument #%d (%s)",uVar2,extramsg);
  }
  else {
    lua_getinfo(L,"nt",&ar);
    uVar3 = arg - (uint)ar.extraargs;
    if (uVar3 == 0 || arg < (int)(uint)ar.extraargs) {
      pcVar4 = "extra argument";
    }
    else {
      iVar1 = strcmp(ar.namewhat,"method");
      pcVar4 = "argument";
      if (iVar1 == 0) {
        uVar2 = (ulong)(uVar3 - 1);
        if (uVar3 - 1 == 0) {
          iVar1 = luaL_error(L,"calling \'%s\' on bad self (%s)",ar.name,extramsg);
          return iVar1;
        }
      }
      else {
        uVar2 = (ulong)uVar3;
      }
    }
    if (ar.name == (char *)0x0) {
      iVar1 = pushglobalfuncname(L,&ar);
      if (iVar1 == 0) {
        ar.name = "?";
      }
      else {
        ar.name = lua_tolstring(L,-1,(size_t *)0x0);
      }
    }
    iVar1 = luaL_error(L,"bad %s #%d to \'%s\' (%s)",pcVar4,uVar2,ar.name,extramsg);
  }
  return iVar1;
}

Assistant:

LUALIB_API int luaL_argerror (lua_State *L, int arg, const char *extramsg) {
  lua_Debug ar;
  const char *argword;
  if (!lua_getstack(L, 0, &ar))  /* no stack frame? */
    return luaL_error(L, "bad argument #%d (%s)", arg, extramsg);
  lua_getinfo(L, "nt", &ar);
  if (arg <= ar.extraargs)  /* error in an extra argument? */
    argword =  "extra argument";
  else {
    arg -= ar.extraargs;  /* do not count extra arguments */
    if (strcmp(ar.namewhat, "method") == 0) {  /* colon syntax? */
      arg--;  /* do not count (extra) self argument */
      if (arg == 0)  /* error in self argument? */
        return luaL_error(L, "calling '%s' on bad self (%s)",
                               ar.name, extramsg);
      /* else go through; error in a regular argument */
    }
    argword = "argument";
  }
  if (ar.name == NULL)
    ar.name = (pushglobalfuncname(L, &ar)) ? lua_tostring(L, -1) : "?";
  return luaL_error(L, "bad %s #%d to '%s' (%s)",
                       argword, arg, ar.name, extramsg);
}